

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

void session_set_state(SESSION_INSTANCE *session_instance,SESSION_STATE session_state)

{
  uint local_18;
  uint32_t i;
  SESSION_STATE session_state_local;
  SESSION_INSTANCE *session_instance_local;
  
  session_instance->previous_session_state = session_instance->session_state;
  session_instance->session_state = session_state;
  for (local_18 = 0; local_18 < session_instance->link_endpoint_count; local_18 = local_18 + 1) {
    if ((session_instance->link_endpoints[local_18]->on_session_state_changed !=
         (ON_SESSION_STATE_CHANGED)0x0) &&
       (session_instance->link_endpoints[local_18]->link_endpoint_state !=
        LINK_ENDPOINT_STATE_DETACHING)) {
      (*session_instance->link_endpoints[local_18]->on_session_state_changed)
                (session_instance->link_endpoints[local_18]->callback_context,session_state,
                 session_instance->previous_session_state);
    }
  }
  return;
}

Assistant:

static void session_set_state(SESSION_INSTANCE* session_instance, SESSION_STATE session_state)
{
    uint32_t i;

    session_instance->previous_session_state = session_instance->session_state;
    session_instance->session_state = session_state;

    for (i = 0; i < session_instance->link_endpoint_count; i++)
    {
        if (session_instance->link_endpoints[i]->on_session_state_changed != NULL)
        {
            if (session_instance->link_endpoints[i]->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
            {
                session_instance->link_endpoints[i]->on_session_state_changed(session_instance->link_endpoints[i]->callback_context, session_state, session_instance->previous_session_state);
            }
        }
    }
}